

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator*=(TPZSkylMatrix<double> *this,double value)

{
  double **ppdVar1;
  _func_int **pp_Var2;
  double **ppdVar3;
  double *pdVar4;
  int iVar5;
  int extraout_var;
  long lVar6;
  long lVar7;
  double *pdVar8;
  
  pp_Var2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  if (1e-12 <= ABS(value)) {
    iVar5 = (*pp_Var2[0xc])();
    ppdVar3 = (this->fElem).fStore;
    lVar7 = 0;
    lVar6 = CONCAT44(extraout_var,iVar5);
    if (CONCAT44(extraout_var,iVar5) == 0 || extraout_var < 0) {
      lVar6 = lVar7;
    }
    while (lVar7 != lVar6) {
      ppdVar1 = ppdVar3 + lVar7;
      pdVar4 = ppdVar3[lVar7 + 1];
      lVar7 = lVar7 + 1;
      for (pdVar8 = *ppdVar1; pdVar8 < pdVar4; pdVar8 = pdVar8 + 1) {
        *pdVar8 = *pdVar8 * value;
      }
    }
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  else {
    (*pp_Var2[0xf])();
  }
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator*=(const TVar value )
{
	if ( IsZero( value ) )
    {
		Zero();
		return( *this );
    }
	
	int64_t col, colmax = this->Dim();
	for (col=0; col<colmax; col++ )
    {
		// Efetua a MULTIPLICACAO.
		TVar *elem = fElem[col];
		TVar *end  = fElem[col+1];
		while ( elem < end ) *elem++ *= value;
    }
	
	this->fDecomposed = 0;
	return( *this );
}